

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_file_control(sqlite3 *db,char *zDbName,int op,void *pArg)

{
  sqlite3_file *psVar1;
  int iVar2;
  Btree *p;
  
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  p = sqlite3DbNameToBtree(db,zDbName);
  if (p == (Btree *)0x0) {
    iVar2 = 1;
  }
  else {
    sqlite3BtreeEnter(p);
    psVar1 = p->pBt->pPager->fd;
    if (op == 7) {
      *(sqlite3_file **)pArg = psVar1;
      iVar2 = 0;
    }
    else if (psVar1->pMethods == (sqlite3_io_methods *)0x0) {
      iVar2 = 0xc;
    }
    else {
      iVar2 = (*psVar1->pMethods->xFileControl)(psVar1,op,pArg);
    }
    sqlite3BtreeLeave(p);
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return iVar2;
}

Assistant:

SQLITE_API int sqlite3_file_control(sqlite3 *db, const char *zDbName, int op, void *pArg){
  int rc = SQLITE_ERROR;
  Btree *pBtree;

  sqlite3_mutex_enter(db->mutex);
  pBtree = sqlite3DbNameToBtree(db, zDbName);
  if( pBtree ){
    Pager *pPager;
    sqlite3_file *fd;
    sqlite3BtreeEnter(pBtree);
    pPager = sqlite3BtreePager(pBtree);
    assert( pPager!=0 );
    fd = sqlite3PagerFile(pPager);
    assert( fd!=0 );
    if( op==SQLITE_FCNTL_FILE_POINTER ){
      *(sqlite3_file**)pArg = fd;
      rc = SQLITE_OK;
    }else if( fd->pMethods ){
      rc = sqlite3OsFileControl(fd, op, pArg);
    }else{
      rc = SQLITE_NOTFOUND;
    }
    sqlite3BtreeLeave(pBtree);
  }
  sqlite3_mutex_leave(db->mutex);
  return rc;   
}